

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O0

Sim_Man_t * Sim_ManStart(Abc_Ntk_t *pNtk,int fLightweight)

{
  int iVar1;
  Sim_Man_t *__s;
  Vec_Ptr_t *pVVar2;
  Extra_MmFixed_t *pEVar3;
  Vec_Int_t *pVVar4;
  Vec_Vec_t *pVVar5;
  Sim_Man_t *p;
  int fLightweight_local;
  Abc_Ntk_t *pNtk_local;
  
  __s = (Sim_Man_t *)malloc(0xa8);
  memset(__s,0,0xa8);
  __s->pNtk = pNtk;
  iVar1 = Abc_NtkCiNum(__s->pNtk);
  __s->nInputs = iVar1;
  iVar1 = Abc_NtkCoNum(__s->pNtk);
  __s->nOutputs = iVar1;
  __s->nSimBits = 0x800;
  __s->nSimWords = (__s->nSimBits >> 5) + (uint)((__s->nSimBits & 0x1fU) != 0);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar2 = Sim_UtilInfoAlloc(iVar1,__s->nSimWords,0);
  __s->vSim0 = pVVar2;
  __s->fLightweight = fLightweight;
  if (__s->fLightweight == 0) {
    iVar1 = Abc_NtkObjNumMax(pNtk);
    pVVar2 = Sim_UtilInfoAlloc(iVar1,__s->nSimWords,0);
    __s->vSim1 = pVVar2;
    iVar1 = Abc_NtkCiNum(pNtk);
    __s->nSuppBits = iVar1;
    __s->nSuppWords = (__s->nSuppBits >> 5) + (uint)((__s->nSuppBits & 0x1fU) != 0);
    pVVar2 = Sim_ComputeStrSupp(pNtk);
    __s->vSuppStr = pVVar2;
    iVar1 = Abc_NtkCoNum(__s->pNtk);
    pVVar2 = Sim_UtilInfoAlloc(iVar1,__s->nSuppWords,1);
    __s->vSuppFun = pVVar2;
    pEVar3 = Extra_MmFixedStart(__s->nSuppWords * 4 + 0x10);
    __s->pMmPat = pEVar3;
    pVVar2 = Vec_PtrAlloc(100);
    __s->vFifo = pVVar2;
    pVVar4 = Vec_IntAlloc(100);
    __s->vDiffs = pVVar4;
    pVVar5 = Vec_VecStart(__s->nInputs);
    __s->vSuppTargs = pVVar5;
  }
  return __s;
}

Assistant:

Sim_Man_t * Sim_ManStart( Abc_Ntk_t * pNtk, int fLightweight )
{
    Sim_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Sim_Man_t, 1 );
    memset( p, 0, sizeof(Sim_Man_t) );
    p->pNtk = pNtk;
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimBits   = 2048;
    p->nSimWords  = SIM_NUM_WORDS(p->nSimBits);
    p->vSim0      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    p->fLightweight = fLightweight;
    if (!p->fLightweight) {
        p->vSim1      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
        // support information
        p->nSuppBits  = Abc_NtkCiNum(pNtk);
        p->nSuppWords = SIM_NUM_WORDS(p->nSuppBits);
        p->vSuppStr   = Sim_ComputeStrSupp( pNtk );
        p->vSuppFun   = Sim_UtilInfoAlloc( Abc_NtkCoNum(p->pNtk),  p->nSuppWords, 1 );
        // other data
        p->pMmPat     = Extra_MmFixedStart( sizeof(Sim_Pat_t) + p->nSuppWords * sizeof(unsigned) ); 
        p->vFifo      = Vec_PtrAlloc( 100 );
        p->vDiffs     = Vec_IntAlloc( 100 );
        // allocate support targets (array of unresolved outputs for each input)
        p->vSuppTargs = Vec_VecStart( p->nInputs );
    }
    return p;
}